

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::CheckPrivateLeak(Parser *this)

{
  bool bVar1;
  reference ppSVar2;
  reference ppFVar3;
  reference ppEVar4;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar5;
  reference ppEVar6;
  Definition *in_RSI;
  EnumVal *val;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_90;
  const_iterator val_it;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_78;
  iterator it_1;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_38;
  iterator fld_it;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_20;
  iterator it;
  Parser *this_local;
  CheckedError *err;
  
  if ((in_RSI[8].name.field_0x7 & 1) == 0) {
    anon_unknown_0::NoError();
  }
  else {
    local_20._M_current =
         (StructDef **)
         std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                   ((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_> *)
                    &in_RSI[1].name.field_2);
    while( true ) {
      struct_def = (StructDef *)
                   std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                   ::end((vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                          *)&in_RSI[1].name.field_2);
      bVar1 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                          *)&struct_def);
      if (!bVar1) break;
      ppSVar2 = __gnu_cxx::
                __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                ::operator*(&local_20);
      fld_it._M_current = (FieldDef **)*ppSVar2;
      local_38._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (&(((StructDef *)fld_it._M_current)->fields).vec);
      while( true ) {
        field = (FieldDef *)
                std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                          ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                            *)(fld_it._M_current + 0x1f));
        bVar1 = __gnu_cxx::operator!=
                          (&local_38,
                           (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&field);
        if (!bVar1) break;
        ppFVar3 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&local_38);
        if (((*ppFVar3)->value).type.enum_def == (EnumDef *)0x0) {
          if (((*ppFVar3)->value).type.struct_def != (StructDef *)0x0) {
            CheckPrivatelyLeakedFields(this,in_RSI,(Definition *)fld_it._M_current);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) goto LAB_0014be7a;
            CheckedError::~CheckedError((CheckedError *)this);
          }
        }
        else {
          CheckPrivatelyLeakedFields(this,in_RSI,(Definition *)fld_it._M_current);
          bVar1 = CheckedError::Check((CheckedError *)this);
          if (bVar1) goto LAB_0014be7a;
          CheckedError::~CheckedError((CheckedError *)this);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_38);
      }
      it_1._M_current =
           (EnumDef **)
           __gnu_cxx::
           __normal_iterator<flatbuffers::StructDef_**,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
           ::operator++(&local_20,0);
    }
    local_78._M_current =
         (EnumDef **)
         std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                   ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_> *)
                    &in_RSI[1].attributes);
    while( true ) {
      enum_def = (EnumDef *)
                 std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                           ((vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                             *)&in_RSI[1].attributes);
      bVar1 = __gnu_cxx::operator!=
                        (&local_78,
                         (__normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                          *)&enum_def);
      if (!bVar1) break;
      ppEVar4 = __gnu_cxx::
                __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                ::operator*(&local_78);
      val_it._M_current = (EnumVal **)*ppEVar4;
      if ((((EnumDef *)val_it._M_current)->is_union & 1U) != 0) {
        pvVar5 = EnumDef::Vals((EnumDef *)val_it._M_current);
        local_90._M_current =
             (EnumVal **)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                       (pvVar5);
        while( true ) {
          pvVar5 = EnumDef::Vals((EnumDef *)val_it._M_current);
          val = (EnumVal *)
                std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                          (pvVar5);
          bVar1 = __gnu_cxx::operator!=
                            (&local_90,
                             (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                              *)&val);
          if (!bVar1) break;
          ppEVar6 = __gnu_cxx::
                    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                    ::operator*(&local_90);
          if (((*ppEVar6)->union_type).struct_def != (StructDef *)0x0) {
            CheckPrivatelyLeakedFields(this,in_RSI,(Definition *)val_it._M_current);
            bVar1 = CheckedError::Check((CheckedError *)this);
            if (bVar1) goto LAB_0014be7a;
            CheckedError::~CheckedError((CheckedError *)this);
          }
          __gnu_cxx::
          __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
          ::operator++(&local_90);
        }
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::EnumDef_**,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
      ::operator++(&local_78);
    }
    anon_unknown_0::NoError();
  }
LAB_0014be7a:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::CheckPrivateLeak() {
  if (!opts.no_leak_private_annotations) return NoError();
  // Iterate over all structs/tables to validate we arent leaking
  // any private (structs/tables/enums)
  for (auto it = structs_.vec.begin(); it != structs_.vec.end(); it++) {
    auto &struct_def = **it;
    for (auto fld_it = struct_def.fields.vec.begin();
         fld_it != struct_def.fields.vec.end(); ++fld_it) {
      auto &field = **fld_it;

      if (field.value.type.enum_def) {
        auto err =
            CheckPrivatelyLeakedFields(struct_def, *field.value.type.enum_def);
        if (err.Check()) { return err; }
      } else if (field.value.type.struct_def) {
        auto err = CheckPrivatelyLeakedFields(struct_def,
                                              *field.value.type.struct_def);
        if (err.Check()) { return err; }
      }
    }
  }
  // Iterate over all enums to validate we arent leaking
  // any private (structs/tables)
  for (auto it = enums_.vec.begin(); it != enums_.vec.end(); ++it) {
    auto &enum_def = **it;
    if (enum_def.is_union) {
      for (auto val_it = enum_def.Vals().begin();
           val_it != enum_def.Vals().end(); ++val_it) {
        auto &val = **val_it;
        if (val.union_type.struct_def) {
          auto err =
              CheckPrivatelyLeakedFields(enum_def, *val.union_type.struct_def);
          if (err.Check()) { return err; }
        }
      }
    }
  }
  return NoError();
}